

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall
xLearn::AUCMetric::Accumulate
          (AUCMetric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  ThreadPool *this_00;
  ThreadPool *pTVar1;
  ostream *poVar2;
  size_type sVar3;
  vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> *pvVar4;
  vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> *pvVar5;
  reference pvVar6;
  reference pvVar7;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long)>
  *in_RDI;
  index_t j;
  index_t i_1;
  size_t end_idx;
  size_t start_idx;
  int i;
  vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> info;
  Info single_info;
  Info *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  value_type vVar8;
  undefined4 in_stack_fffffffffffffe0c;
  value_type *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  _Head_base<4UL,_unsigned_long,_false> __args_1;
  Info *in_stack_fffffffffffffe20;
  _func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_Info_ptr_unsigned_long_unsigned_long
  *__f;
  undefined8 in_stack_fffffffffffffe38;
  ThreadPool *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  int line;
  string *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  LogSeverity severity;
  uint local_140;
  uint local_13c;
  int local_d0;
  vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> local_c8;
  undefined1 local_b0 [55];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  this_00 = (ThreadPool *)std::vector<float,_std::allocator<float>_>::size(in_RSI);
  pTVar1 = (ThreadPool *)std::vector<float,_std::allocator<float>_>::size(local_18);
  if (this_00 != pTVar1) {
    Logger::Logger(&local_1c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Accumulate",&local_79);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffe88,line,in_stack_fffffffffffffe78);
    poVar2 = std::operator<<(poVar2,"CHECK_EQ failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x205);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"Y.size()");
    poVar2 = std::operator<<(poVar2," = ");
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"pred.size()");
    poVar2 = std::operator<<(poVar2," = ");
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe10);
    abort();
  }
  __f = (_func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_Info_ptr_unsigned_long_unsigned_long
         *)local_b0;
  Info::Info(in_stack_fffffffffffffe20);
  pvVar4 = (vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> *)
           (in_RDI->_M_bound_args).
           super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
           .
           super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
           .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
           super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
           super__Head_base<3UL,_unsigned_long,_false>._M_head_impl;
  std::allocator<xLearn::AUCMetric::Info>::allocator((allocator<xLearn::AUCMetric::Info> *)0x1f7705)
  ;
  std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::vector
            (pvVar4,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  std::allocator<xLearn::AUCMetric::Info>::~allocator
            ((allocator<xLearn::AUCMetric::Info> *)0x1f7730);
  for (local_d0 = 0;
      (ulong)(long)local_d0 <
      (in_RDI->_M_bound_args).
      super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
      .
      super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
      .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
      super__Head_base<3UL,_unsigned_long,_false>._M_head_impl; local_d0 = local_d0 + 1) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
    getStart(sVar3,(in_RDI->_M_bound_args).
                   super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                   .
                   super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                   .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
                   super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
                   super__Head_base<3UL,_unsigned_long,_false>._M_head_impl,(long)local_d0);
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
    getEnd(sVar3,(in_RDI->_M_bound_args).
                 super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                 .
                 super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                 .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
                 super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
                 super__Head_base<3UL,_unsigned_long,_false>._M_head_impl,(long)local_d0);
    __args_1._M_head_impl =
         (in_RDI->_M_bound_args).
         super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
         .
         super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
         .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
         super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<4UL,_unsigned_long>.
         super__Head_base<4UL,_unsigned_long,_false>._M_head_impl;
    std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::operator[]
              (&local_c8,(long)local_d0);
    std::
    bind<void(&)(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long),std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long&,unsigned_long&>
              (__f,(vector<float,_std::allocator<float>_> **)pvVar4,
               (vector<float,_std::allocator<float>_> **)__args_1._M_head_impl,
               (Info **)in_stack_fffffffffffffe10,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (unsigned_long *)in_stack_fffffffffffffe40);
    ThreadPool::
    enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long)>>
              (this_00,in_RDI);
    std::future<void>::~future((future<void> *)0x1f7875);
  }
  ThreadPool::Sync(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  local_13c = 0;
  while( true ) {
    pvVar4 = (vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> *)
             (ulong)local_13c;
    pvVar5 = (vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> *)
             std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::size
                       (&local_c8);
    if (pvVar5 <= pvVar4) break;
    for (local_140 = 0; local_140 < 1000000; local_140 = local_140 + 1) {
      pvVar6 = std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::
               operator[](&local_c8,(ulong)local_13c);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&pvVar6->positive_vec_,(ulong)local_140);
      vVar8 = *pvVar7;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &(in_RDI->_M_bound_args).
                           super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                           .
                           super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                           .
                           super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                           .super__Head_base<2UL,_xLearn::AUCMetric::Info_*,_false>,(ulong)local_140
                         );
      *pvVar7 = vVar8 + *pvVar7;
      pvVar6 = std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::
               operator[](&local_c8,(ulong)local_13c);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&pvVar6->negative_vec_,(ulong)local_140);
      vVar8 = *pvVar7;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 1),
                          (ulong)local_140);
      *pvVar7 = vVar8 + *pvVar7;
    }
    local_13c = local_13c + 1;
  }
  std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::~vector(pvVar4);
  Info::~Info(in_stack_fffffffffffffe00);
  return;
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    // multi-thread
    Info single_info;
    std::vector<Info> info(threadNumber_, single_info);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(auc_accum_thread,
                               &Y,
                               &pred,
                               &(info[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all thread finish their job
    pool_->Sync(threadNumber_);
    for (index_t i = 0; i < info.size(); ++i) {
      for (index_t j = 0; j < kMaxBucketSize; ++j) {
        all_positive_number_[j] += info[i].positive_vec_[j];
        all_negative_number_[j] += info[i].negative_vec_[j];
      }
    } 
  }